

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaAddItemSize(xmlSchemaItemListPtr *list,int initialSize,void *item)

{
  int iVar1;
  xmlSchemaItemListPtr pxVar2;
  
  if (*list == (xmlSchemaItemListPtr)0x0) {
    pxVar2 = xmlSchemaItemListCreate();
    *list = pxVar2;
    if (pxVar2 == (xmlSchemaItemListPtr)0x0) {
      return 0;
    }
  }
  iVar1 = xmlSchemaItemListAddSize(*list,initialSize,item);
  return iVar1;
}

Assistant:

static int
xmlSchemaAddItemSize(xmlSchemaItemListPtr *list, int initialSize, void *item)
{
    if (*list == NULL) {
	*list = xmlSchemaItemListCreate();
	if (*list == NULL)
	    return(-1);
    }
    xmlSchemaItemListAddSize(*list, initialSize, item);
    return(0);
}